

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aead_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d4e6f::AEADTest_WycheproofAESGCM_Test::TestBody
          (AEADTest_WycheproofAESGCM_Test *this)

{
  anon_class_1_0_00000001 local_31;
  function<void_(FileTest_*)> local_30;
  AEADTest_WycheproofAESGCM_Test *local_10;
  AEADTest_WycheproofAESGCM_Test *this_local;
  
  local_10 = this;
  std::function<void(FileTest*)>::
  function<(anonymous_namespace)::AEADTest_WycheproofAESGCM_Test::TestBody()::__0,void>
            ((function<void(FileTest*)> *)&local_30,&local_31);
  FileTestGTest("third_party/wycheproof_testvectors/aes_gcm_test.txt",&local_30);
  std::function<void_(FileTest_*)>::~function(&local_30);
  return;
}

Assistant:

TEST(AEADTest, WycheproofAESGCM) {
  FileTestGTest("third_party/wycheproof_testvectors/aes_gcm_test.txt",
                [](FileTest *t) {
                  std::string key_size_str;
                  ASSERT_TRUE(t->GetInstruction(&key_size_str, "keySize"));
                  const EVP_AEAD *aead;
                  switch (atoi(key_size_str.c_str())) {
                    case 128:
                      aead = EVP_aead_aes_128_gcm();
                      break;
                    case 192:
                      aead = EVP_aead_aes_192_gcm();
                      break;
                    case 256:
                      aead = EVP_aead_aes_256_gcm();
                      break;
                    default:
                      FAIL() << "Unknown key size: " << key_size_str;
                  }

                  RunWycheproofTestCase(t, aead);
                });
}